

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_new_object(Group *this,View *view)

{
  char cVar1;
  int iVar2;
  Code *pCVar3;
  Code *pCVar4;
  undefined4 extraout_var;
  list<r_code::Code_*> *this_00;
  undefined8 extraout_RDX;
  Code *local_30;
  long *local_28;
  Code *ref;
  uint64_t i;
  View *view_local;
  Group *this_local;
  
  i = (uint64_t)view;
  view_local = (View *)this;
  pCVar3 = core::P<r_code::Code>::operator->(&(view->super_View).object);
  (*(pCVar3->super__Object)._vptr__Object[4])(pCVar3,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x3c) {
    ref = (Code *)0x0;
    while( true ) {
      pCVar3 = ref;
      pCVar4 = core::P<r_code::Code>::operator->((P<r_code::Code> *)(i + 0x20));
      iVar2 = (*(pCVar4->super__Object)._vptr__Object[10])();
      pCVar4 = (Code *)(ulong)(ushort)iVar2;
      if (pCVar4 <= pCVar3) break;
      pCVar3 = core::P<r_code::Code>::operator->((P<r_code::Code> *)(i + 0x20));
      iVar2 = (*(pCVar3->super__Object)._vptr__Object[9])
                        (pCVar3,(ulong)ref & 0xffff,extraout_RDX,
                         CONCAT62((int6)((ulong)pCVar4 >> 0x10),(short)ref));
      local_28 = (long *)CONCAT44(extraout_var,iVar2);
      (**(code **)(*local_28 + 0x98))();
      this_00 = (list<r_code::Code_*> *)(local_28 + 3);
      local_30 = core::P::operator_cast_to_Code_((P *)(i + 0x20));
      r_code::list<r_code::Code_*>::push_back(this_00,&local_30);
      (**(code **)(*local_28 + 0xa0))();
      ref = (Code *)((long)&(ref->super__Object)._vptr__Object + 1);
    }
  }
  inject(this,(View *)i);
  notifyNew(this,(View *)i);
  return;
}

Assistant:

void Group::inject_new_object(View *view)   // the view can hold anything but groups and notifications.
{
    //uint64_t t0=Now();
    switch (view->object->code(0).getDescriptor()) {
    case Atom::MARKER: // the marker does not exist yet: add it to the mks of its references.
        for (uint64_t i = 0; i < view->object->references_size(); ++i) {
            Code *ref = view->object->get_reference(i);
            ref->acq_markers();
            ref->markers.push_back(view->object);
            ref->rel_markers();
        }

        break;

    default:
        break;
    }

    inject(view);
    notifyNew(view);
    //uint64_t t1=Now();
    //std::cout<<"injection: "<<t1-t0<<std::endl;
}